

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O2

void __thiscall inja::Lexer::start(Lexer *this,string_view input)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string_view prefix;
  
  (this->m_in)._M_len = input._M_len;
  (this->m_in)._M_str = input._M_str;
  this->state = Text;
  this->minus_state = Number;
  this->tok_start = 0;
  this->pos = 0;
  prefix._M_str = anon_var_dwarf_76690;
  prefix._M_len = 3;
  bVar1 = string_view::starts_with(input,prefix);
  if (bVar1) {
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&this->m_in,3,0xffffffffffffffff);
    (this->m_in)._M_len = bVar2._M_len;
    (this->m_in)._M_str = bVar2._M_str;
  }
  return;
}

Assistant:

void start(std::string_view input) {
    m_in = input;
    tok_start = 0;
    pos = 0;
    state = State::Text;
    minus_state = MinusState::Number;

    // Consume byte order mark (BOM) for UTF-8
    if (inja::string_view::starts_with(m_in, "\xEF\xBB\xBF")) {
      m_in = m_in.substr(3);
    }
  }